

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFileDB.cpp
# Opt level: O2

void __thiscall
ObjectFileDB::write_object_file_words(ObjectFileDB *this,string *output_dir,bool dump_v3_only)

{
  uint uVar1;
  key_type *pkVar2;
  pointer pOVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  undefined7 in_register_00000011;
  key_type *__k;
  char *__s;
  pointer pOVar6;
  double dVar7;
  double dVar8;
  uint local_fc;
  Timer timer;
  string file_name;
  string file_text;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __s = "- Writing object file dumps (all)...";
  if ((int)CONCAT71(in_register_00000011,dump_v3_only) != 0) {
    __s = "- Writing object file dumps (v3 only)...";
  }
  puts(__s);
  Timer::Timer(&timer);
  pkVar2 = (this->obj_file_order).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __k = (this->obj_file_order).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  if ((this->obj_files_by_name)._M_h._M_element_count == (long)pkVar2 - (long)__k >> 5) {
    uVar1 = 0;
    local_fc = 0;
    for (; __k != pkVar2; __k = __k + 1) {
      pmVar5 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)this,__k);
      pOVar3 = (pmVar5->super__Vector_base<ObjectFileData,_std::allocator<ObjectFileData>_>)._M_impl
               .super__Vector_impl_data._M_finish;
      for (pOVar6 = (pmVar5->super__Vector_base<ObjectFileData,_std::allocator<ObjectFileData>_>).
                    _M_impl.super__Vector_impl_data._M_start; pOVar6 != pOVar3; pOVar6 = pOVar6 + 1)
      {
        if ((pOVar6->linked_data).segments == 3 || !dump_v3_only) {
          LinkedObjectFile::print_words_abi_cxx11_(&file_text,&pOVar6->linked_data);
          ObjectFileRecord::to_unique_name_abi_cxx11_(&local_70,&pOVar6->record);
          std::operator+(&local_50,&local_70,".txt");
          combine_path(&file_name,output_dir,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          sVar4 = file_text._M_string_length;
          write_text_file(&file_name,&file_text);
          uVar1 = uVar1 + (int)sVar4;
          local_fc = local_fc + 1;
          std::__cxx11::string::~string((string *)&file_name);
          std::__cxx11::string::~string((string *)&file_text);
        }
      }
    }
    puts("Wrote object file dumps:");
    printf(" total %d files\n",(ulong)local_fc);
    printf(" total %.3f MB\n",(double)((float)uVar1 * 9.536743e-07));
    dVar7 = Timer::getMs(&timer);
    dVar8 = Timer::getSeconds(&timer);
    printf(" total %.3f ms (%.3f MB/sec)\n",dVar7,(double)uVar1 / (dVar8 * 1048576.0));
    putchar(10);
    return;
  }
  __assert_fail("obj_files_by_name.size() == obj_file_order.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.h"
                ,0x3e,
                "void ObjectFileDB::for_each_obj(Func) [Func = (lambda at /workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp:278:16)]"
               );
}

Assistant:

void ObjectFileDB::write_object_file_words(const std::string& output_dir, bool dump_v3_only) {
  if (dump_v3_only) {
    printf("- Writing object file dumps (v3 only)...\n");
  } else {
    printf("- Writing object file dumps (all)...\n");
  }

  Timer timer;
  uint32_t total_bytes = 0, total_files = 0;

  for_each_obj([&](ObjectFileData& obj) {
    if (obj.linked_data.segments == 3 || !dump_v3_only) {
      auto file_text = obj.linked_data.print_words();
      auto file_name = combine_path(output_dir, obj.record.to_unique_name() + ".txt");
      total_bytes += file_text.size();
      write_text_file(file_name, file_text);
      total_files++;
    }
  });

  printf("Wrote object file dumps:\n");
  printf(" total %d files\n", total_files);
  printf(" total %.3f MB\n", total_bytes / ((float)(1u << 20u)));
  printf(" total %.3f ms (%.3f MB/sec)\n", timer.getMs(),
         total_bytes / ((1u << 20u) * timer.getSeconds()));
  printf("\n");
}